

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAbbrev.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugAbbrev::DWARFDebugAbbrev(DWARFDebugAbbrev *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Data).Storage.hasVal = false;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PrevAbbrOffsetPos)._M_node = (_Base_ptr)0x0;
  (this->Data).Storage.field_0.empty = '\0';
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>_>_>
  ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>_>_>
           *)this);
  (this->PrevAbbrOffsetPos)._M_node = &p_Var1->_M_header;
  return;
}

Assistant:

DWARFDebugAbbrev::DWARFDebugAbbrev() { clear(); }